

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O0

void MultX(AES_state *s)

{
  ushort uVar1;
  uint16_t top;
  AES_state *s_local;
  
  uVar1 = s->slice[7];
  s->slice[7] = s->slice[6];
  s->slice[6] = s->slice[5];
  s->slice[5] = s->slice[4];
  s->slice[4] = s->slice[3] ^ uVar1;
  s->slice[3] = s->slice[2] ^ uVar1;
  s->slice[2] = s->slice[1];
  s->slice[1] = s->slice[0] ^ uVar1;
  s->slice[0] = uVar1;
  return;
}

Assistant:

static void MultX(AES_state* s) {
    uint16_t top = s->slice[7];
    s->slice[7] = s->slice[6];
    s->slice[6] = s->slice[5];
    s->slice[5] = s->slice[4];
    s->slice[4] = s->slice[3] ^ top;
    s->slice[3] = s->slice[2] ^ top;
    s->slice[2] = s->slice[1];
    s->slice[1] = s->slice[0] ^ top;
    s->slice[0] = top;
}